

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPublicKey.cpp
# Opt level: O0

bool __thiscall DSAPublicKey::deserialise(DSAPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  ByteString *in_RDI;
  ByteString dY;
  ByteString dG;
  ByteString dQ;
  ByteString dP;
  undefined1 local_c8 [40];
  undefined1 local_a0 [56];
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  sVar1 = ByteString::size((ByteString *)0x14f115);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x14f134);
    if (sVar1 != 0) {
      sVar1 = ByteString::size((ByteString *)0x14f150);
      if (sVar1 != 0) {
        sVar1 = ByteString::size((ByteString *)0x14f16c);
        if (sVar1 != 0) {
          (*in_RDI->_vptr_ByteString[6])(in_RDI,local_40);
          (*in_RDI->_vptr_ByteString[7])(in_RDI,local_68);
          (*in_RDI->_vptr_ByteString[8])(in_RDI,local_a0);
          (*in_RDI->_vptr_ByteString[9])(in_RDI,local_c8);
          local_1 = 1;
          goto LAB_0014f26d;
        }
      }
    }
  }
  local_1 = 0;
LAB_0014f26d:
  ByteString::~ByteString((ByteString *)0x14f277);
  ByteString::~ByteString((ByteString *)0x14f281);
  ByteString::~ByteString((ByteString *)0x14f28e);
  ByteString::~ByteString((ByteString *)0x14f29b);
  return (bool)(local_1 & 1);
}

Assistant:

bool DSAPublicKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dY = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dQ.size() == 0) ||
	    (dG.size() == 0) ||
	    (dY.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setG(dG);
	setY(dY);

	return true;
}